

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void QtPromisePrivate::PromiseDispatch<float>::
     call<QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>,std::function<float()>>
               (QPromiseResolve<float> *resolve,QPromiseReject<float> *reject,function<float_()> *fn
               )

{
  float local_24;
  function<float_()> *local_20;
  function<float_()> *fn_local;
  QPromiseReject<float> *reject_local;
  QPromiseResolve<float> *resolve_local;
  
  local_20 = fn;
  fn_local = (function<float_()> *)reject;
  reject_local = (QPromiseReject<float> *)resolve;
  local_24 = std::function<float_()>::operator()(fn);
  PromiseFulfill<float>::
  call<float,QtPromise::QPromiseResolve<float>,QtPromise::QPromiseReject<float>>
            (&local_24,(QPromiseResolve<float> *)reject_local,(QPromiseReject<float> *)fn_local);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }